

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O1

void __thiscall iDynTree::LinkVelArray::LinkVelArray(LinkVelArray *this,Model *model)

{
  (this->m_linkTwist).super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_linkTwist).super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_linkTwist).super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resize(this,model);
  return;
}

Assistant:

LinkVelArray::LinkVelArray(const Model& model)
{
    resize(model);
}